

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::RoundingImpl::apply
          (RoundingImpl *this,DecimalQuantity *value,UErrorCode *status)

{
  bool bVar1;
  int32_t iVar2;
  int32_t x;
  int32_t iVar3;
  int32_t candidate_1;
  int32_t candidate;
  int32_t roundingMag;
  int32_t displayMag;
  UErrorCode *status_local;
  DecimalQuantity *value_local;
  RoundingImpl *this_local;
  
  if ((this->fPassThrough & 1U) == 0) {
    switch((this->fPrecision).fType) {
    case RND_BOGUS:
    case RND_ERROR:
      *status = U_INTERNAL_PROGRAM_ERROR;
      break;
    case RND_NONE:
      DecimalQuantity::roundToInfinity(value);
      break;
    case RND_FRACTION:
      iVar2 = anon_unknown.dwarf_157244::getRoundingMagnitudeFraction
                        ((int)(this->fPrecision).fUnion.fracSig.fMaxFrac);
      DecimalQuantity::roundToMagnitude(value,iVar2,this->fRoundingMode,status);
      iVar2 = anon_unknown.dwarf_157244::getDisplayMagnitudeFraction
                        ((int)(this->fPrecision).fUnion.fracSig.fMinFrac);
      iVar2 = uprv_max_63(0,-iVar2);
      DecimalQuantity::setFractionLength(value,iVar2,0x7fffffff);
      break;
    case RND_SIGNIFICANT:
      iVar2 = anon_unknown.dwarf_157244::getRoundingMagnitudeSignificant
                        (value,(int)(this->fPrecision).fUnion.fracSig.fMaxSig);
      DecimalQuantity::roundToMagnitude(value,iVar2,this->fRoundingMode,status);
      iVar2 = anon_unknown.dwarf_157244::getDisplayMagnitudeSignificant
                        (value,(int)(this->fPrecision).fUnion.fracSig.fMinSig);
      iVar2 = uprv_max_63(0,-iVar2);
      DecimalQuantity::setFractionLength(value,iVar2,0x7fffffff);
      bVar1 = DecimalQuantity::isZero(value);
      if ((bVar1) && (0 < (this->fPrecision).fUnion.fracSig.fMinSig)) {
        DecimalQuantity::setIntegerLength(value,1,0x7fffffff);
      }
      break;
    case RND_FRACTION_SIGNIFICANT:
      iVar2 = anon_unknown.dwarf_157244::getDisplayMagnitudeFraction
                        ((int)(this->fPrecision).fUnion.fracSig.fMinFrac);
      x = anon_unknown.dwarf_157244::getRoundingMagnitudeFraction
                    ((int)(this->fPrecision).fUnion.fracSig.fMaxFrac);
      if ((this->fPrecision).fUnion.fracSig.fMinSig == -1) {
        iVar3 = anon_unknown.dwarf_157244::getRoundingMagnitudeSignificant
                          (value,(int)(this->fPrecision).fUnion.fracSig.fMaxSig);
        candidate_1 = uprv_max_63(x,iVar3);
      }
      else {
        iVar3 = anon_unknown.dwarf_157244::getDisplayMagnitudeSignificant
                          (value,(int)(this->fPrecision).fUnion.fracSig.fMinSig);
        candidate_1 = uprv_min_63(x,iVar3);
      }
      DecimalQuantity::roundToMagnitude(value,candidate_1,this->fRoundingMode,status);
      iVar2 = uprv_max_63(0,-iVar2);
      DecimalQuantity::setFractionLength(value,iVar2,0x7fffffff);
      break;
    case RND_INCREMENT:
      DecimalQuantity::roundToIncrement
                (value,(this->fPrecision).fUnion.increment.fIncrement,this->fRoundingMode,
                 (int)(this->fPrecision).fUnion.increment.fMaxFrac,status);
      DecimalQuantity::setFractionLength
                (value,(int)(this->fPrecision).fUnion.increment.fMinFrac,0x7fffffff);
      break;
    case RND_CURRENCY:
    }
  }
  return;
}

Assistant:

void RoundingImpl::apply(impl::DecimalQuantity &value, UErrorCode& status) const {
    if (fPassThrough) {
        return;
    }
    switch (fPrecision.fType) {
        case Precision::RND_BOGUS:
        case Precision::RND_ERROR:
            // Errors should be caught before the apply() method is called
            status = U_INTERNAL_PROGRAM_ERROR;
            break;

        case Precision::RND_NONE:
            value.roundToInfinity();
            break;

        case Precision::RND_FRACTION:
            value.roundToMagnitude(
                    getRoundingMagnitudeFraction(fPrecision.fUnion.fracSig.fMaxFrac),
                    fRoundingMode,
                    status);
            value.setFractionLength(
                    uprv_max(0, -getDisplayMagnitudeFraction(fPrecision.fUnion.fracSig.fMinFrac)),
                    INT32_MAX);
            break;

        case Precision::RND_SIGNIFICANT:
            value.roundToMagnitude(
                    getRoundingMagnitudeSignificant(value, fPrecision.fUnion.fracSig.fMaxSig),
                    fRoundingMode,
                    status);
            value.setFractionLength(
                    uprv_max(0, -getDisplayMagnitudeSignificant(value, fPrecision.fUnion.fracSig.fMinSig)),
                    INT32_MAX);
            // Make sure that digits are displayed on zero.
            if (value.isZero() && fPrecision.fUnion.fracSig.fMinSig > 0) {
                value.setIntegerLength(1, INT32_MAX);
            }
            break;

        case Precision::RND_FRACTION_SIGNIFICANT: {
            int32_t displayMag = getDisplayMagnitudeFraction(fPrecision.fUnion.fracSig.fMinFrac);
            int32_t roundingMag = getRoundingMagnitudeFraction(fPrecision.fUnion.fracSig.fMaxFrac);
            if (fPrecision.fUnion.fracSig.fMinSig == -1) {
                // Max Sig override
                int32_t candidate = getRoundingMagnitudeSignificant(
                        value,
                        fPrecision.fUnion.fracSig.fMaxSig);
                roundingMag = uprv_max(roundingMag, candidate);
            } else {
                // Min Sig override
                int32_t candidate = getDisplayMagnitudeSignificant(
                        value,
                        fPrecision.fUnion.fracSig.fMinSig);
                roundingMag = uprv_min(roundingMag, candidate);
            }
            value.roundToMagnitude(roundingMag, fRoundingMode, status);
            value.setFractionLength(uprv_max(0, -displayMag), INT32_MAX);
            break;
        }

        case Precision::RND_INCREMENT:
            value.roundToIncrement(
                    fPrecision.fUnion.increment.fIncrement,
                    fRoundingMode,
                    fPrecision.fUnion.increment.fMaxFrac,
                    status);
            value.setFractionLength(fPrecision.fUnion.increment.fMinFrac, INT32_MAX);
            break;

        case Precision::RND_CURRENCY:
            // Call .withCurrency() before .apply()!
            U_ASSERT(false);
            break;
    }
}